

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

int nn_sws_recv_hdr(nn_sws *self)

{
  int iVar1;
  long in_RDI;
  int *in_stack_00000008;
  size_t in_stack_00000010;
  void *in_stack_00000018;
  nn_usock *in_stack_00000020;
  
  if (*(int *)(in_RDI + 0x1650) == 0) {
    iVar1 = nn_list_empty((nn_list *)(in_RDI + 0x1670));
    if (iVar1 == 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_empty (&self->inmsg_array)",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x15f);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined8 *)(in_RDI + 0x1680) = 0;
    *(undefined4 *)(in_RDI + 0x1698) = 0;
    *(undefined8 *)(in_RDI + 0x1688) = 0;
    *(undefined8 *)(in_RDI + 0x1690) = 0;
  }
  memset((void *)(in_RDI + 0x169d),0,0x7d);
  memset((void *)(in_RDI + 0x1624),0,0xe);
  *(undefined4 *)(in_RDI + 0x1620) = 1;
  nn_usock_recv(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return 0;
}

Assistant:

static int nn_sws_recv_hdr (struct nn_sws *self)
{
    if (!self->continuing) {
        nn_assert (nn_list_empty (&self->inmsg_array));

        self->inmsg_current_chunk_buf = NULL;
        self->inmsg_chunks = 0;
        self->inmsg_current_chunk_len = 0;
        self->inmsg_total_size = 0;
    }

    memset (self->inmsg_control, 0, NN_SWS_PAYLOAD_MAX_LENGTH);
    memset (self->inhdr, 0, NN_SWS_FRAME_MAX_HDR_LEN);
    self->instate = NN_SWS_INSTATE_RECV_HDR;
    nn_usock_recv (self->usock, self->inhdr, NN_SWS_FRAME_SIZE_INITIAL, NULL);

    return 0;
}